

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O2

void __thiscall QEvdevTouchScreenHandler::unregisterPointingDevice(QEvdevTouchScreenHandler *this)

{
  long *plVar1;
  undefined8 uVar2;
  
  plVar1 = *(long **)(this + 0x28);
  if (plVar1 != (long *)0x0) {
    if (QCoreApplication::self == 0) {
      (**(code **)(*plVar1 + 0x20))(plVar1);
    }
    else {
      uVar2 = QObject::thread();
      QObject::moveToThread(plVar1,uVar2);
      QObject::deleteLater();
    }
    *(undefined8 *)(this + 0x28) = 0;
  }
  return;
}

Assistant:

void QEvdevTouchScreenHandler::unregisterPointingDevice()
{
    if (!m_device)
        return;

    if (QGuiApplication::instance()) {
        m_device->moveToThread(QGuiApplication::instance()->thread());
        m_device->deleteLater();
    } else {
        delete m_device;
    }
    m_device = nullptr;
}